

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_minnow_byt_compatible.c
# Opt level: O2

mraa_result_t mraa_intel_minnowboard_get_pin_index(mraa_board_t *board,char *name,int *pin_index)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = 0;
  uVar4 = (ulong)(uint)board->phy_pin_count;
  if (board->phy_pin_count < 1) {
    uVar4 = uVar2;
  }
  uVar3 = 0;
  while( true ) {
    if (uVar4 == uVar3) {
      return MRAA_ERROR_INVALID_RESOURCE;
    }
    iVar1 = strncmp(name,board->pins->name + uVar2,8);
    if (iVar1 == 0) break;
    uVar3 = uVar3 + 1;
    uVar2 = uVar2 + 0x2f4;
  }
  *pin_index = (int)uVar3;
  return MRAA_SUCCESS;
}

Assistant:

mraa_result_t
mraa_intel_minnowboard_get_pin_index(mraa_board_t* board, char* name, int* pin_index)
{
    int i;
    for (i = 0; i < board->phy_pin_count; ++i) {
        if (strncmp(name, board->pins[i].name, MAX_LENGTH) == 0) {
            *pin_index = i;
            return MRAA_SUCCESS;
        }
    }
    return MRAA_ERROR_INVALID_RESOURCE;
}